

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O2

bool __thiscall helics::Federate::isQueryCompleted(Federate *this,QueryId *queryIndex)

{
  future_status fVar1;
  iterator iVar2;
  bool bVar3;
  handle asyncInfo;
  duration<long,_std::ratio<1L,_1L>_> local_30;
  handle local_28;
  
  if (this->singleThreadFederate == false) {
    gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>::lock
              (&local_28,
               (this->asyncCallInfo)._M_t.
               super___uniq_ptr_impl<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
               .
               super__Head_base<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_false>
               ._M_head_impl);
    local_30.__r._0_4_ = queryIndex->ivalue;
    iVar2 = std::
            _Rb_tree<int,_std::pair<const_int,_std::future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_int,_std::future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::find(&((local_28.data)->inFlightQueries)._M_t,(key_type *)&local_30);
    if ((_Rb_tree_header *)iVar2._M_node ==
        &((local_28.data)->inFlightQueries)._M_t._M_impl.super__Rb_tree_header) {
      bVar3 = false;
    }
    else {
      local_30.__r = 0;
      fVar1 = std::__basic_future<std::__cxx11::string>::wait_for<long,std::ratio<1l,1l>>
                        ((__basic_future<std::__cxx11::string> *)&iVar2._M_node[1]._M_parent,
                         &local_30);
      bVar3 = fVar1 == ready;
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_28.m_handle_lock);
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool Federate::isQueryCompleted(QueryId queryIndex) const  // NOLINT
{
    if (singleThreadFederate) {
        return false;
    }
    auto asyncInfo = asyncCallInfo->lock();
    auto fnd = asyncInfo->inFlightQueries.find(queryIndex.value());
    if (fnd != asyncInfo->inFlightQueries.end()) {
        return (fnd->second.wait_for(std::chrono::seconds(0)) == std::future_status::ready);
    }
    return false;
}